

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void lj_snap_grow_map_(jit_State *J,MSize need)

{
  SnapEntry *pSVar1;
  uint local_14;
  MSize need_local;
  jit_State *J_local;
  
  if (need < J->sizesnapmap << 1) {
    local_14 = J->sizesnapmap << 1;
  }
  else {
    local_14 = need;
    if (need < 0x40) {
      local_14 = 0x40;
    }
  }
  pSVar1 = (SnapEntry *)
           lj_mem_realloc(J->L,J->snapmapbuf,(ulong)J->sizesnapmap << 2,(ulong)local_14 << 2);
  J->snapmapbuf = pSVar1;
  (J->cur).snapmap = J->snapmapbuf;
  J->sizesnapmap = local_14;
  return;
}

Assistant:

void lj_snap_grow_map_(jit_State *J, MSize need)
{
  if (need < 2*J->sizesnapmap)
    need = 2*J->sizesnapmap;
  else if (need < 64)
    need = 64;
  J->snapmapbuf = (SnapEntry *)lj_mem_realloc(J->L, J->snapmapbuf,
		    J->sizesnapmap*sizeof(SnapEntry), need*sizeof(SnapEntry));
  J->cur.snapmap = J->snapmapbuf;
  J->sizesnapmap = need;
}